

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

void sptk::snack::xcwindow(float *din,float *dout,int n,float preemp,int *wsizep,float **windp)

{
  int *in_RCX;
  int in_EDX;
  float *in_RSI;
  float *in_RDI;
  undefined8 *in_R8;
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  double half;
  double arg;
  float co;
  float *q;
  float *wind;
  int wsize;
  float *p;
  int i;
  size_t in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  double dVar3;
  double local_68;
  float *local_50;
  float *local_48;
  float *local_38;
  int local_2c;
  float *local_10;
  float *local_8;
  
  local_48 = (float *)*in_R8;
  if (*in_RCX != in_EDX) {
    local_68 = 0.5;
    if (local_48 == (float *)0x0) {
      local_48 = (float *)ckalloc(0x13c7f6);
    }
    else {
      local_48 = (float *)ckrealloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_2c = 0;
    local_50 = local_48;
    while (local_2c < in_EDX) {
      dVar3 = local_68;
      dVar2 = cos(((double)local_2c + 0.5) * (6.2831854 / (double)in_EDX));
      fVar1 = (float)(dVar3 * (1.0 - dVar2));
      *local_50 = fVar1 * fVar1 * fVar1 * fVar1;
      local_50 = local_50 + 1;
      local_2c = local_2c + 1;
    }
    *in_RCX = in_EDX;
    *in_R8 = local_48;
  }
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    local_50 = local_48;
    local_38 = in_RDI + 1;
    local_2c = in_EDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    while (local_2c != 0) {
      *local_10 = *local_50 * (-in_XMM0_Da * *local_8 + *local_38);
      local_50 = local_50 + 1;
      local_38 = local_38 + 1;
      local_2c = local_2c + -1;
      local_10 = local_10 + 1;
      local_8 = local_8 + 1;
    }
  }
  else {
    local_50 = local_48;
    local_2c = in_EDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    while (local_2c != 0) {
      *local_10 = *local_50 * *local_8;
      local_50 = local_50 + 1;
      local_2c = local_2c + -1;
      local_10 = local_10 + 1;
      local_8 = local_8 + 1;
    }
  }
  return;
}

Assistant:

void xcwindow(float *din, float *dout, int n, float preemp, int* wsizep,
              float **windp)
#endif
{
  register int i;
  register float *p;
#if 0
  static int wsize = 0;
  static float *wind=NULL;
#else
  int wsize = *wsizep;
  float *wind = *windp;
#endif
  register float *q, co;
 
  if(wsize != n) {		/* Need to create a new cos**4 window? */
    register double arg, half=0.5;
    
    if(wind) wind = (float*)ckrealloc((void *)wind,n*sizeof(float));
    else wind = (float*)ckalloc(n*sizeof(float));
    wsize = n;
    for(i=0, arg=3.1415927*2.0/(wsize), q=wind; i < n; ) {
      co = (float) (half*(1.0 - cos((half + (double)i++) * arg)));
      *q++ = co * co * co * co;
    }
#if 1
    *wsizep = wsize;
    *windp = wind;
#endif
  }
/* If preemphasis is to be performed,  this assumes that there are n+1 valid
   samples in the input buffer (din). */
  if(preemp != 0.0) {
    for(i=n, p=din+1, q=wind; i--; )
      *dout++ = (float) (*q++ * ((float)(*p++) - (preemp * *din++)));
  } else {
    for(i=n, q=wind; i--; )
      *dout++ = *q++ * *din++;
  }
}